

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O1

int mbedtls_mpi_cmp_int(mbedtls_mpi *X,mbedtls_mpi_sint z)

{
  int iVar1;
  mbedtls_mpi_uint p [1];
  mbedtls_mpi Y;
  mbedtls_mpi_uint local_18;
  mbedtls_mpi local_10;
  
  local_10.p = &local_18;
  local_18 = -z;
  if (0 < z) {
    local_18 = z;
  }
  local_10.s = (ushort)(z >> 0x3e) | 1;
  local_10.n = 1;
  iVar1 = mbedtls_mpi_cmp_mpi(X,&local_10);
  return iVar1;
}

Assistant:

int mbedtls_mpi_cmp_int(const mbedtls_mpi *X, mbedtls_mpi_sint z)
{
    mbedtls_mpi Y;
    mbedtls_mpi_uint p[1];

    *p  = mpi_sint_abs(z);
    Y.s = TO_SIGN(z);
    Y.n = 1;
    Y.p = p;

    return mbedtls_mpi_cmp_mpi(X, &Y);
}